

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O2

bool __thiscall
binlog::SessionWriter::
addEvent<std::unique_ptr<int,std::default_delete<int>>const&,std::unique_ptr<int,std::default_delete<int>>const&,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>const&,int>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          unique_ptr<int,_std::default_delete<int>_> *args,
          unique_ptr<int,_std::default_delete<int>_> *args_1,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *args_2,
          int *args_3)

{
  size_t size;
  QueueWriter *this_00;
  char **ppcVar1;
  int *piVar2;
  int *piVar3;
  Queue *pQVar4;
  bool bVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long local_68 [2];
  uint local_58;
  undefined4 uStack_54;
  uint uStack_50;
  undefined4 uStack_4c;
  size_t local_48;
  undefined8 local_40;
  
  local_68[0] = 8;
  local_68[1] = 8;
  piVar2 = (args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  piVar3 = (args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  uVar9 = -(uint)((int)piVar3 == 0 && (int)((ulong)piVar3 >> 0x20) == 0);
  uVar10 = -(uint)((int)piVar2 == 0 && (int)((ulong)piVar2 >> 0x20) == 0);
  local_58 = uVar9 & 1 | ~uVar9 & 5;
  uStack_50 = uVar10 & 1 | ~uVar10 & 5;
  uStack_54 = 0;
  uStack_4c = 0;
  local_48 = mserialize::detail::
             BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
             ::serialized_size(args_2);
  local_40 = 4;
  lVar8 = 0;
  for (lVar6 = 0; lVar6 != 0x30; lVar6 = lVar6 + 8) {
    lVar8 = lVar8 + *(long *)((long)local_68 + lVar6);
  }
  size = lVar8 + 4;
  this_00 = &this->_qw;
  bVar5 = detail::QueueWriter::beginWrite(this_00,size);
  if (!bVar5) {
    replaceChannel(this,size);
    bVar5 = detail::QueueWriter::beginWrite(this_00,size);
    if (!bVar5) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)lVar8;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 4;
  *(uint64_t *)(pcVar7 + 4) = eventSourceId;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 8;
  *(uint64_t *)(pcVar7 + 8) = clock;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 8;
  mserialize::detail::BuiltinSerializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
  serialize<binlog::detail::QueueWriter>(args,this_00);
  mserialize::detail::BuiltinSerializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
  serialize<binlog::detail::QueueWriter>(args_1,this_00);
  mserialize::detail::
  BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
  ::serialize<binlog::detail::QueueWriter>(args_2,this_00);
  *(int *)(this->_qw)._writePos = *args_3;
  pQVar4 = (this->_qw)._queue;
  pcVar7 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar7;
  (pQVar4->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar7 - (long)pQVar4->buffer
  ;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}